

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2channel_x11_sharing_handover
               (SshChannel *sc,ssh_sharing_connstate *share_cs,share_channel *share_chan,
               char *peer_addr,int peer_port,int endian,int protomajor,int protominor,
               void *initial_data,int initial_len)

{
  ssh2_channel *c;
  int endian_local;
  int peer_port_local;
  char *peer_addr_local;
  share_channel *share_chan_local;
  ssh_sharing_connstate *share_cs_local;
  SshChannel *sc_local;
  
  sc[-1].vt = (SshChannelVtable *)share_cs;
  share_setup_x11_channel
            (share_cs,share_chan,*(uint *)((long)&sc[-0xb].cl + 4),*(uint *)&sc[-0xb].cl,
             *(uint *)&sc[-4].vt,*(uint *)((long)&sc[-4].vt + 4),*(uint *)&sc[-4].cl,peer_addr,
             peer_port,endian,protomajor,protominor,initial_data,initial_len);
  chan_free((Channel *)sc[-1].cl);
  sc[-1].cl = (ConnectionLayer *)0x0;
  return;
}

Assistant:

static void ssh2channel_x11_sharing_handover(
    SshChannel *sc, ssh_sharing_connstate *share_cs, share_channel *share_chan,
    const char *peer_addr, int peer_port, int endian,
    int protomajor, int protominor, const void *initial_data, int initial_len)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    /*
     * This function is called when we've just discovered that an X
     * forwarding channel on which we'd been handling the initial auth
     * ourselves turns out to be destined for a connection-sharing
     * downstream. So we turn the channel into a sharing one, meaning
     * that we completely stop tracking windows and buffering data and
     * just pass more or less unmodified SSH messages back and forth.
     */
    c->sharectx = share_cs;
    share_setup_x11_channel(share_cs, share_chan,
                            c->localid, c->remoteid, c->remwindow,
                            c->remmaxpkt, c->locwindow,
                            peer_addr, peer_port, endian,
                            protomajor, protominor,
                            initial_data, initial_len);
    chan_free(c->chan);
    c->chan = NULL;
}